

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Man_t * Gia_ManEquivRemapDfs(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *p_00;
  Gia_Rpr_t *pGVar2;
  long lVar3;
  Vec_Int_t *p_01;
  uint *puVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  int iVar9;
  size_t __nmemb;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  p_00 = Gia_ManDupDfs(p);
  iVar9 = p_00->nObjs;
  pGVar2 = (Gia_Rpr_t *)calloc((long)iVar9,4);
  p_00->pReprs = pGVar2;
  if (0 < (long)iVar9) {
    lVar3 = 0;
    do {
      p_00->pReprs[lVar3] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar3] | 0xfffffff);
      lVar3 = lVar3 + 1;
    } while (lVar3 < p_00->nObjs);
  }
  iVar9 = p->nObjs;
  if (1 < iVar9) {
    lVar3 = 1;
    lVar6 = 5;
    do {
      if (((uint)p->pReprs[lVar3] & 0xfffffff) == 0) {
        uVar10 = *(uint *)(&p->pObjs->field_0x0 + lVar6 * 4);
        if ((int)uVar10 < 0) {
LAB_001ffcdf:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (uVar10 < 2) {
LAB_001ffcfe:
          __assert_fail("Num == GIA_VOID || Num < Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
        }
        p_00->pReprs[uVar10 >> 1] = (Gia_Rpr_t)((uint)p_00->pReprs[uVar10 >> 1] & 0xf0000000);
        iVar9 = p->nObjs;
      }
      lVar3 = lVar3 + 1;
      lVar6 = lVar6 + 3;
    } while (lVar3 < iVar9);
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  puVar4 = (uint *)malloc(400);
  p_01->pArray = (int *)puVar4;
  if (1 < iVar9) {
    uVar12 = 1;
    do {
      if (((~(uint)p->pReprs[uVar12] & 0xfffffff) == 0) && (piVar5 = p->pNexts, 0 < piVar5[uVar12]))
      {
        p_01->nSize = 0;
        uVar7 = uVar12 & 0xffffffff;
        do {
          if (p->nObjs <= (int)uVar7) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar10 = p->pObjs[uVar7].Value;
          if ((int)uVar10 < 0) goto LAB_001ffcdf;
          uVar10 = uVar10 >> 1;
          if (0 < (long)p_01->nSize) {
            lVar3 = 0;
            do {
              if (p_01->pArray[lVar3] == uVar10) goto LAB_001ffc0e;
              lVar3 = lVar3 + 1;
            } while (p_01->nSize != lVar3);
          }
          Vec_IntPush(p_01,uVar10);
          piVar5 = p->pNexts;
LAB_001ffc0e:
          puVar4 = (uint *)(piVar5 + uVar7);
          uVar7 = (ulong)*puVar4;
        } while (0 < (int)*puVar4);
        __nmemb = (size_t)p_01->nSize;
        if ((long)__nmemb < 2) {
          __assert_fail("Vec_IntSize( vClass ) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x3b9,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
        }
        puVar4 = (uint *)p_01->pArray;
        qsort(puVar4,__nmemb,4,Vec_IntSortCompare1);
        uVar10 = *puVar4;
        sVar8 = 1;
        uVar11 = uVar10;
        do {
          uVar1 = puVar4[sVar8];
          if ((uVar10 != 0xfffffff) && ((int)uVar1 <= (int)uVar10)) goto LAB_001ffcfe;
          p_00->pReprs[(int)uVar1] =
               (Gia_Rpr_t)((uint)p_00->pReprs[(int)uVar1] & 0xf0000000 | uVar10 & 0xfffffff);
          if ((int)uVar1 <= (int)uVar11) {
            __assert_fail("iPrev < iNode",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                          ,0x3bf,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
          }
          sVar8 = sVar8 + 1;
          uVar11 = uVar1;
        } while (__nmemb != sVar8);
        iVar9 = p->nObjs;
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)iVar9);
  }
  if (puVar4 != (uint *)0x0) {
    free(puVar4);
  }
  free(p_01);
  piVar5 = Gia_ManDeriveNexts(p_00);
  p_00->pNexts = piVar5;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManEquivRemapDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr, iPrev;
    pNew = Gia_ManDupDfs( p );
    // start representatives
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
    for ( i = 0; i < Gia_ManObjNum(pNew); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
        Gia_ObjSetRepr( pNew, Abc_Lit2Var(Gia_ManObj(p, i)->Value), 0 );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
            Vec_IntPushUnique( vClass, Abc_Lit2Var(Gia_ManObj(p, k)->Value) );
        assert( Vec_IntSize( vClass ) > 1 );
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pNew, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pNew->pNexts = Gia_ManDeriveNexts( pNew );
    return pNew;
}